

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void pubnonce_summing_to_inf(secp256k1_musig_pubnonce *pubnonce)

{
  int iVar1;
  long in_RDI;
  secp256k1_musig_pubnonce *pubnonce_ptr [2];
  secp256k1_gej summed_pubnonces [2];
  int i;
  secp256k1_ge ge [2];
  secp256k1_ge *in_stack_fffffffffffffe28;
  secp256k1_ge *in_stack_fffffffffffffe30;
  secp256k1_ge *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffee0;
  secp256k1_musig_pubnonce **in_stack_fffffffffffffee8;
  secp256k1_gej *in_stack_fffffffffffffef0;
  secp256k1_context *in_stack_fffffffffffffef8;
  int local_bc;
  
  testutil_random_ge_test(in_stack_fffffffffffffe50);
  testutil_random_ge_test(in_stack_fffffffffffffe50);
  for (local_bc = 0; local_bc < 2; local_bc = local_bc + 1) {
    secp256k1_musig_pubnonce_save
              ((secp256k1_musig_pubnonce *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    *(long *)(&stack0xfffffffffffffe28 + (long)local_bc * 8) = in_RDI + (long)local_bc * 0x84;
    secp256k1_ge_neg(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    secp256k1_ge_neg(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  }
  secp256k1_musig_sum_pubnonces
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x16717e);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x6b,"test condition failed: secp256k1_gej_is_infinity(&summed_pubnonces[0])");
    abort();
  }
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1671da);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x6c,"test condition failed: secp256k1_gej_is_infinity(&summed_pubnonces[1])");
    abort();
  }
  return;
}

Assistant:

static void pubnonce_summing_to_inf(secp256k1_musig_pubnonce *pubnonce) {
    secp256k1_ge ge[2];
    int i;
    secp256k1_gej summed_pubnonces[2];
    const secp256k1_musig_pubnonce *pubnonce_ptr[2];

    testutil_random_ge_test(&ge[0]);
    testutil_random_ge_test(&ge[1]);

    for (i = 0; i < 2; i++) {
        secp256k1_musig_pubnonce_save(&pubnonce[i], ge);
        pubnonce_ptr[i] = &pubnonce[i];
        secp256k1_ge_neg(&ge[0], &ge[0]);
        secp256k1_ge_neg(&ge[1], &ge[1]);
    }

    secp256k1_musig_sum_pubnonces(CTX, summed_pubnonces, pubnonce_ptr, 2);
    CHECK(secp256k1_gej_is_infinity(&summed_pubnonces[0]));
    CHECK(secp256k1_gej_is_infinity(&summed_pubnonces[1]));
}